

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<8192,Blob<224>>
               (hashfunc<Blob<224>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  pfHash p_Var2;
  reference pvVar3;
  size_type sVar4;
  byte in_CL;
  uint in_EDX;
  char *pcVar5;
  uint in_ESI;
  byte in_R8B;
  byte in_R9B;
  bool result;
  keytype k;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> hashes;
  undefined4 in_stack_fffffffffffffbc8;
  byte bVar6;
  undefined4 in_stack_fffffffffffffbcc;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *in_stack_fffffffffffffbd0;
  Blob<8192> *in_stack_fffffffffffffbd8;
  uint8_t in_stack_fffffffffffffbe7;
  int in_stack_fffffffffffffbe8;
  int in_stack_fffffffffffffbec;
  pfHash in_stack_fffffffffffffbf0;
  uint8_t in_stack_fffffffffffffcab;
  uint8_t in_stack_fffffffffffffcac;
  uint8_t in_stack_fffffffffffffcad;
  uint8_t in_stack_fffffffffffffcae;
  uint8_t in_stack_fffffffffffffcaf;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *in_stack_fffffffffffffcb0;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [8];
  
  local_d = (byte)in_EDX & 1;
  local_e = in_CL & 1;
  local_f = in_R8B & 1;
  local_10 = in_R9B & 1;
  pcVar5 = "exactly";
  if ((in_EDX & 1) != 0) {
    pcVar5 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x2000,pcVar5,(ulong)in_ESI);
  std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::vector
            ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)0x18936f);
  Blob<8192>::Blob((Blob<8192> *)&stack0xfffffffffffffbd8);
  memset(&stack0xfffffffffffffbd8,0,0x400);
  if ((local_d & 1) != 0) {
    std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::resize
              (in_stack_fffffffffffffbd0,
               CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    p_Var2 = hashfunc::operator_cast_to_function_pointer(local_8);
    pvVar3 = std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::operator[](&local_28,0);
    (*p_Var2)(&stack0xfffffffffffffbd8,0x400,0,pvVar3);
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<8192>,Blob<224>>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8,
             (bool)in_stack_fffffffffffffbe7,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  sVar4 = std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::size(&local_28);
  printf("%d keys\n",sVar4 & 0xffffffff);
  bVar6 = 1;
  bVar1 = TestHashList<Blob<224>>
                    (in_stack_fffffffffffffcb0,(bool)in_stack_fffffffffffffcaf,
                     (bool)in_stack_fffffffffffffcae,(bool)in_stack_fffffffffffffcad,
                     (bool)in_stack_fffffffffffffcac,(bool)in_stack_fffffffffffffcab);
  bVar6 = bVar1 & bVar6;
  printf("\n");
  std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::~vector
            ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)CONCAT44(in_ESI,in_EDX));
  return (bool)(bVar6 & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive,
                     bool testColl, bool testDist, bool drawDiagram )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits,
         inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashes.resize(1);
    hash(&k,sizeof(keytype),0,&hashes[0]);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}